

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereSplit(WhereClause *pWC,Expr *pExpr,u8 op)

{
  Expr *pEVar1;
  u8 in_DL;
  WhereClause *in_RSI;
  long in_RDI;
  Expr *unaff_retaddr;
  Expr *pE2;
  undefined7 in_stack_ffffffffffffffe8;
  
  pEVar1 = sqlite3ExprSkipCollate((Expr *)in_RSI);
  *(u8 *)(in_RDI + 0x10) = in_DL;
  if (pEVar1 != (Expr *)0x0) {
    if (pEVar1->op == in_DL) {
      sqlite3WhereSplit(in_RSI,(Expr *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),
                        (u8)((ulong)pEVar1 >> 0x38));
      sqlite3WhereSplit(in_RSI,(Expr *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),
                        (u8)((ulong)pEVar1 >> 0x38));
    }
    else {
      whereClauseInsert((WhereClause *)pE2,unaff_retaddr,(u16)((ulong)in_RDI >> 0x30));
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereSplit(WhereClause *pWC, Expr *pExpr, u8 op){
  Expr *pE2 = sqlite3ExprSkipCollate(pExpr);
  pWC->op = op;
  if( pE2==0 ) return;
  if( pE2->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    sqlite3WhereSplit(pWC, pE2->pLeft, op);
    sqlite3WhereSplit(pWC, pE2->pRight, op);
  }
}